

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_case.h
# Opt level: O0

test_result * __thiscall
ut::test_case_impl<agge::tests::ScanlineAdapterTests>::execute
          (test_result *__return_storage_ptr__,
          test_case_impl<agge::tests::ScanlineAdapterTests> *this)

{
  setup_impl<agge::tests::ScanlineAdapterTests> *psVar1;
  code *local_138;
  exception *e;
  exception *e_2;
  exception *e_1;
  undefined1 local_4b [8];
  ScanlineAdapterTests f;
  string outcome;
  bool terminated;
  bool passed;
  bool initialized;
  test_case_impl<agge::tests::ScanlineAdapterTests> *this_local;
  
  std::__cxx11::string::string((string *)&f.field_0x3);
  agge::tests::ScanlineAdapterTests::ScanlineAdapterTests((ScanlineAdapterTests *)local_4b);
  psVar1 = shared_ptr<ut::setup_impl<agge::tests::ScanlineAdapterTests>,_unsigned_int>::operator->
                     (&this->_setup);
  setup_impl<agge::tests::ScanlineAdapterTests>::init(psVar1,(EVP_PKEY_CTX *)local_4b);
  local_138 = (code *)this->_method;
  if (((ulong)local_138 & 1) != 0) {
    local_138 = *(code **)(local_138 + *(long *)(local_4b + *(long *)&this->field_0x10) + -1);
  }
  (*local_138)(local_4b + *(long *)&this->field_0x10);
  psVar1 = shared_ptr<ut::setup_impl<agge::tests::ScanlineAdapterTests>,_unsigned_int>::operator->
                     (&this->_setup);
  setup_impl<agge::tests::ScanlineAdapterTests>::teardown(psVar1,(ScanlineAdapterTests *)local_4b);
  test_result::test_result(__return_storage_ptr__,true,true,true,(string *)&f.field_0x3);
  std::__cxx11::string::~string((string *)&f.field_0x3);
  return __return_storage_ptr__;
}

Assistant:

inline test_result test_case_impl<Fixture>::execute()
	{
		bool initialized = false;
		bool passed = false;
		bool terminated = false;
		std::string outcome;

		try
		{
			Fixture f;

			try
			{
				_setup->init(f);
				initialized = true;

				try
				{
					(f.*_method)();
					passed = true;
				}
				catch (const std::exception &e)
				{
					outcome = e.what();
				}
				catch (...)
				{
					outcome = "Test Failed!";
				}

				try
				{
					_setup->teardown(f);
					terminated = true;
				}
				catch (const std::exception &e)
				{
					outcome += outcome.empty() ? "" : "\n";
					outcome += std::string("Teardown Failed: ") + e.what();
				}
				catch (...)
				{
					outcome += outcome.empty() ? "" : "\n";
					outcome += "Teardown Failed!";
				}
			}
			catch (const std::exception &e)
			{
				outcome = std::string("Initialization Failed: ") + e.what();
			}
			catch (...)
			{
				outcome = "Initialization Failed!";
			}
		}
		catch (...)
		{
		}
		return test_result(initialized, passed, terminated, outcome);
	}